

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool crnd::crnd_validate_file(void *pData,uint32 data_size,crn_file_info *pFile_info)

{
  crn_packed_uint<4U> *this;
  uchar uVar1;
  byte bVar2;
  ushort uVar3;
  uint16 uVar4;
  ushort uVar5;
  uint uVar6;
  uint32 uVar7;
  uint uVar8;
  crn_header *pcVar9;
  ulong uVar10;
  crn_packed_uint<4U> *this_00;
  bool bVar11;
  
  if (pFile_info != (crn_file_info *)0x0) {
    if (*(int *)pFile_info != 0x68) {
      return false;
    }
    *(undefined8 *)(pFile_info + 0x54) = 0;
    *(undefined8 *)(pFile_info + 0x5c) = 0;
    *(undefined8 *)(pFile_info + 0x44) = 0;
    *(undefined8 *)(pFile_info + 0x4c) = 0;
    *(undefined8 *)(pFile_info + 0x34) = 0;
    *(undefined8 *)(pFile_info + 0x3c) = 0;
    *(undefined8 *)(pFile_info + 0x24) = 0;
    *(undefined8 *)(pFile_info + 0x2c) = 0;
    *(undefined8 *)(pFile_info + 0x14) = 0;
    *(undefined8 *)(pFile_info + 0x1c) = 0;
    *(undefined8 *)(pFile_info + 4) = 0;
    *(undefined8 *)(pFile_info + 0xc) = 0;
    *(undefined4 *)(pFile_info + 100) = 0;
  }
  if ((0x3d < data_size && pData != (void *)0x0) &&
     (pcVar9 = crnd_get_header(pData,data_size), pcVar9 != (crn_header *)0x0)) {
    this = &pcVar9->m_data_size;
    uVar5 = *(ushort *)(pcVar9->m_header_size).m_buf;
    uVar3 = uVar5 << 8 | uVar5 >> 8;
    uVar4 = crc16(this,uVar3 - 6,0);
    uVar5 = *(ushort *)(pcVar9->m_header_crc16).m_buf;
    if ((ushort)(uVar5 << 8 | uVar5 >> 8) != uVar4) {
      return false;
    }
    uVar6 = crn_packed_uint::operator_cast_to_unsigned_int(this);
    uVar5 = *(ushort *)(pcVar9->m_header_size).m_buf;
    uVar4 = crc16((void *)((long)pData + (ulong)uVar3),uVar6 - (ushort)(uVar5 << 8 | uVar5 >> 8),0);
    uVar5 = *(ushort *)(pcVar9->m_data_crc16).m_buf;
    if ((ushort)(uVar5 << 8 | uVar5 >> 8) != uVar4) {
      return false;
    }
    uVar1 = (pcVar9->m_faces).m_buf[0];
    if ((((uVar1 == '\x06') || (uVar1 == '\x01')) &&
        (uVar5 = *(ushort *)(pcVar9->m_width).m_buf, uVar5 = uVar5 << 8 | uVar5 >> 8,
        0xffffefff < uVar5 - 0x1001)) &&
       (((uVar3 = *(ushort *)(pcVar9->m_height).m_buf, uVar3 = uVar3 << 8 | uVar3 >> 8,
         0xffffefff < uVar3 - 0x1001 && (bVar2 = (pcVar9->m_levels).m_buf[0], bVar2 != 0)) &&
        (uVar7 = utils::compute_max_mips((uint)uVar5,(uint)uVar3), bVar2 <= uVar7)))) {
      bVar11 = (pcVar9->m_format).m_buf[0] < 0xf;
      if (bVar11 && pFile_info != (crn_file_info *)0x0) {
        uVar6 = crn_packed_uint::operator_cast_to_unsigned_int(this);
        *(uint *)(pFile_info + 4) = uVar6;
        uVar5 = *(ushort *)(pcVar9->m_header_size).m_buf;
        *(uint *)(pFile_info + 8) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        *(uint *)(pFile_info + 0xc) =
             ((uint)(pcVar9->m_alpha_selectors).m_size.m_buf[2] |
             (uint)(pcVar9->m_alpha_selectors).m_size.m_buf[1] << 8 |
             (uint)(pcVar9->m_alpha_selectors).m_size.m_buf[0] << 0x10) +
             ((uint)(pcVar9->m_alpha_endpoints).m_size.m_buf[2] |
             (uint)(pcVar9->m_alpha_endpoints).m_size.m_buf[1] << 8 |
             (uint)(pcVar9->m_alpha_endpoints).m_size.m_buf[0] << 0x10) +
             ((uint)(pcVar9->m_color_selectors).m_size.m_buf[2] |
             (uint)(pcVar9->m_color_selectors).m_size.m_buf[1] << 8 |
             (uint)(pcVar9->m_color_selectors).m_size.m_buf[0] << 0x10) +
             ((uint)(pcVar9->m_color_endpoints).m_size.m_buf[2] |
             (uint)(pcVar9->m_color_endpoints).m_size.m_buf[1] << 8 |
             (uint)(pcVar9->m_color_endpoints).m_size.m_buf[0] << 0x10);
        uVar5 = *(ushort *)(pcVar9->m_tables_size).m_buf;
        *(uint *)(pFile_info + 0x10) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        *(uint *)(pFile_info + 0x14) = (uint)(pcVar9->m_levels).m_buf[0];
        this_00 = pcVar9->m_level_ofs;
        uVar10 = 0;
        while (uVar10 < (pcVar9->m_levels).m_buf[0]) {
          uVar6 = crn_packed_uint::operator_cast_to_unsigned_int(this);
          if (uVar10 + 1 < (ulong)(pcVar9->m_levels).m_buf[0]) {
            uVar6 = crn_packed_uint::operator_cast_to_unsigned_int(this_00 + 1);
          }
          uVar8 = crn_packed_uint::operator_cast_to_unsigned_int(this_00);
          *(uint *)(pFile_info + uVar10 * 4 + 0x18) = uVar6 - uVar8;
          this_00 = this_00 + 1;
          uVar10 = uVar10 + 1;
        }
        uVar5 = *(ushort *)(pcVar9->m_color_endpoints).m_num.m_buf;
        *(uint *)(pFile_info + 0x58) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        uVar5 = *(ushort *)(pcVar9->m_color_selectors).m_num.m_buf;
        *(uint *)(pFile_info + 0x5c) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        uVar5 = *(ushort *)(pcVar9->m_alpha_endpoints).m_num.m_buf;
        *(uint *)(pFile_info + 0x60) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        uVar5 = *(ushort *)(pcVar9->m_alpha_selectors).m_num.m_buf;
        *(uint *)(pFile_info + 100) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        return true;
      }
      return bVar11;
    }
  }
  return false;
}

Assistant:

bool crnd_validate_file(const void* pData, uint32 data_size, crn_file_info* pFile_info)
    {
        if (pFile_info)
        {
            if (pFile_info->m_struct_size != sizeof(crn_file_info))
                return false;

            memset(&pFile_info->m_struct_size + 1, 0, sizeof(crn_file_info) - sizeof(pFile_info->m_struct_size));
        }

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        const uint32 header_crc = crc16(&pHeader->m_data_size, (uint32)(pHeader->m_header_size - ((const uint8*)&pHeader->m_data_size - (const uint8*)pHeader)));
        if (header_crc != pHeader->m_header_crc16)
            return false;

        const uint32 data_crc = crc16((const uint8*)pData + pHeader->m_header_size, pHeader->m_data_size - pHeader->m_header_size);
        if (data_crc != pHeader->m_data_crc16)
            return false;

        if ((pHeader->m_faces != 1) && (pHeader->m_faces != 6))
            return false;
        if ((pHeader->m_width < 1) || (pHeader->m_width > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_height < 1) || (pHeader->m_height > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_levels < 1) || (pHeader->m_levels > utils::compute_max_mips(pHeader->m_width, pHeader->m_height)))
            return false;
        if (((int)pHeader->m_format < cCRNFmtDXT1) || ((int)pHeader->m_format >= cCRNFmtTotal))
            return false;

        if (pFile_info)
        {
            pFile_info->m_actual_data_size = pHeader->m_data_size;
            pFile_info->m_header_size = pHeader->m_header_size;
            pFile_info->m_total_palette_size = pHeader->m_color_endpoints.m_size + pHeader->m_color_selectors.m_size + pHeader->m_alpha_endpoints.m_size + pHeader->m_alpha_selectors.m_size;
            pFile_info->m_tables_size = pHeader->m_tables_size;

            pFile_info->m_levels = pHeader->m_levels;

            for (uint32 i = 0; i < pHeader->m_levels; i++)
            {
                uint32 next_ofs = pHeader->m_data_size;

                // assumes the levels are packed together sequentially
                if ((i + 1) < pHeader->m_levels)
                    next_ofs = pHeader->m_level_ofs[i + 1];

                pFile_info->m_level_compressed_size[i] = next_ofs - pHeader->m_level_ofs[i];
            }

            pFile_info->m_color_endpoint_palette_entries = pHeader->m_color_endpoints.m_num;
            pFile_info->m_color_selector_palette_entries = pHeader->m_color_selectors.m_num;;
            pFile_info->m_alpha_endpoint_palette_entries = pHeader->m_alpha_endpoints.m_num;;
            pFile_info->m_alpha_selector_palette_entries = pHeader->m_alpha_selectors.m_num;;
        }

        return true;
    }